

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrsbit.c
# Opt level: O1

FT_Error pfr_load_bitmap_bits
                   (FT_Byte *p,FT_Byte *limit,FT_UInt format,FT_Bool decreasing,FT_Bitmap *target)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uchar *in_RAX;
  uchar *puVar4;
  uchar uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  FT_Byte FVar10;
  FT_UInt n;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  
  uVar8 = target->rows;
  if ((uVar8 == 0) || (uVar2 = target->width, uVar2 == 0)) goto LAB_0014b1d9;
  iVar3 = target->pitch;
  uVar11 = uVar2 * uVar8;
  lVar15 = 0;
  if (decreasing == '\0') {
    lVar15 = (long)(int)((uVar8 - 1) * iVar3);
    iVar3 = -iVar3;
  }
  in_RAX = target->buffer + lVar15;
  if (format == 2) {
    uVar8 = 0;
    if (uVar11 == 0) {
LAB_0014b1d1:
      uVar5 = '\0';
      bVar17 = true;
    }
    else {
      bVar16 = true;
      bVar17 = true;
      uVar6 = 0x80;
      puVar4 = in_RAX;
      uVar12 = uVar2;
      uVar7 = 0;
      do {
        if ((bVar17) && (p < limit)) {
          lVar15 = (long)limit - (long)p;
          pbVar9 = p;
          do {
            uVar7 = (uint)*pbVar9;
            bVar16 = (bool)(bVar16 ^ 1);
            p = pbVar9 + 1;
            if (*pbVar9 != 0) goto LAB_0014b176;
            lVar15 = lVar15 + -1;
            pbVar9 = pbVar9 + 1;
          } while (lVar15 != 0);
          uVar7 = 0;
          p = limit;
        }
LAB_0014b176:
        uVar14 = uVar6;
        if (!bVar16) {
          uVar14 = 0;
        }
        uVar8 = uVar8 | uVar14;
        uVar12 = uVar12 - 1;
        if (uVar12 == 0) {
          *in_RAX = (uchar)uVar8;
          puVar4 = puVar4 + iVar3;
          uVar8 = 0;
          uVar6 = 0x80;
          in_RAX = puVar4;
          uVar12 = uVar2;
        }
        else if (uVar6 < 2) {
          *in_RAX = (uchar)uVar8;
          uVar8 = 0;
          uVar6 = 0x80;
          in_RAX = in_RAX + 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
        uVar5 = (uchar)uVar8;
        bVar17 = (int)uVar7 < 2;
        uVar11 = uVar11 - 1;
        uVar7 = uVar7 - 1;
      } while (uVar11 != 0);
      bVar17 = uVar6 == 0x80;
    }
  }
  else if (format == 1) {
    uVar8 = 0;
    if (uVar11 == 0) goto LAB_0014b1d1;
    bVar17 = true;
    uVar6 = 0x80;
    uVar7 = 0;
    uVar14 = 0;
    bVar16 = true;
    puVar4 = in_RAX;
    uVar12 = uVar2;
    do {
      uVar13 = uVar14;
      if (bVar17) {
        do {
          if (bVar16) {
            bVar16 = limit <= p;
            uVar13 = uVar14;
            if (bVar16) break;
            bVar1 = *p;
            uVar7 = bVar1 & 0xf;
            p = p + 1;
            uVar13 = (uint)(bVar1 >> 4);
          }
          else {
            bVar16 = true;
            uVar13 = uVar7;
          }
          uVar14 = 0;
        } while (uVar13 == 0);
      }
      uVar14 = uVar6;
      if (!bVar16) {
        uVar14 = 0;
      }
      uVar8 = uVar8 | uVar14;
      uVar12 = uVar12 - 1;
      if (uVar12 == 0) {
        *in_RAX = (uchar)uVar8;
        puVar4 = puVar4 + iVar3;
        uVar8 = 0;
        uVar6 = 0x80;
        in_RAX = puVar4;
        uVar12 = uVar2;
      }
      else if (uVar6 < 2) {
        *in_RAX = (uchar)uVar8;
        uVar8 = 0;
        uVar6 = 0x80;
        in_RAX = in_RAX + 1;
      }
      else {
        uVar6 = uVar6 >> 1;
      }
      uVar5 = (uchar)uVar8;
      uVar14 = uVar13 - 1;
      bVar17 = (int)uVar13 < 2;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    bVar17 = uVar6 == 0x80;
  }
  else {
    if (format != 0) goto LAB_0014b1d9;
    uVar8 = ((int)limit - (int)p) * 8;
    if (uVar11 <= uVar8) {
      uVar8 = uVar11;
    }
    uVar11 = 0;
    if (uVar8 == 0) goto LAB_0014b1d1;
    uVar6 = 0x80;
    FVar10 = '\0';
    puVar4 = in_RAX;
    uVar7 = uVar2;
    uVar12 = uVar8;
    do {
      if (((uVar12 ^ uVar8) & 7) == 0) {
        FVar10 = *p;
        p = p + 1;
      }
      uVar11 = uVar11 | (int)(char)FVar10 >> 7 & uVar6;
      uVar7 = uVar7 - 1;
      if (uVar7 == 0) {
        *in_RAX = (uchar)uVar11;
        puVar4 = puVar4 + iVar3;
        uVar11 = 0;
        uVar6 = 0x80;
        in_RAX = puVar4;
        uVar7 = uVar2;
      }
      else if (uVar6 < 2) {
        *in_RAX = (uchar)uVar11;
        uVar11 = 0;
        uVar6 = 0x80;
        in_RAX = in_RAX + 1;
      }
      else {
        uVar6 = uVar6 >> 1;
      }
      uVar5 = (uchar)uVar11;
      FVar10 = FVar10 * '\x02';
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    bVar17 = uVar6 == 0x80;
  }
  if (!bVar17) {
    *in_RAX = uVar5;
  }
LAB_0014b1d9:
  return (FT_Error)in_RAX;
}

Assistant:

static FT_Error
  pfr_load_bitmap_bits( FT_Byte*    p,
                        FT_Byte*    limit,
                        FT_UInt     format,
                        FT_Bool     decreasing,
                        FT_Bitmap*  target )
  {
    FT_Error          error = FT_Err_Ok;
    PFR_BitWriterRec  writer;


    if ( target->rows > 0 && target->width > 0 )
    {
      pfr_bitwriter_init( &writer, target, decreasing );

      switch ( format )
      {
      case 0: /* packed bits */
        pfr_bitwriter_decode_bytes( &writer, p, limit );
        break;

      case 1: /* RLE1 */
        pfr_bitwriter_decode_rle1( &writer, p, limit );
        break;

      case 2: /* RLE2 */
        pfr_bitwriter_decode_rle2( &writer, p, limit );
        break;

      default:
        ;
      }
    }

    return error;
  }